

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O3

void __thiscall liblogger::LogMQ::LogMQ(LogMQ *this,string *qname)

{
  pointer pcVar1;
  mqd_t mVar2;
  ostream *poVar3;
  LogException *this_00;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogMQ_00144678;
  (this->m_QName)._M_dataplus._M_p = (pointer)&(this->m_QName).field_2;
  pcVar1 = (qname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_QName,pcVar1,pcVar1 + qname->_M_string_length);
  mVar2 = mq_open((qname->_M_dataplus)._M_p,1,0x180,0);
  this->m_id = mVar2;
  if (-1 < mVar2) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"failed to open queue \'",0x16);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(qname->_M_dataplus)._M_p,qname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&local_1d0);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogMQ::LogMQ(const std::string &qname) :
	m_QName(qname)
{
	m_id = mq_open(qname.c_str(), O_WRONLY,  S_IRUSR | S_IWUSR, NULL);
	if (m_id < 0) {
		std::stringstream ss;
		ss << "failed to open queue '" << qname << "'";
		throw(LogException(ss.str()));
	}
}